

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpapiex.c
# Opt level: O0

int buildBufferIfNotExist
              (BUFFER_HANDLE originalRequestContent,_Bool *isOriginalRequestContent,
              BUFFER_HANDLE *toBeUsedRequestContent)

{
  BUFFER_HANDLE pBVar1;
  undefined4 local_24;
  int result;
  BUFFER_HANDLE *toBeUsedRequestContent_local;
  _Bool *isOriginalRequestContent_local;
  BUFFER_HANDLE originalRequestContent_local;
  
  if (originalRequestContent == (BUFFER_HANDLE)0x0) {
    pBVar1 = BUFFER_new();
    *toBeUsedRequestContent = pBVar1;
    if (*toBeUsedRequestContent == (BUFFER_HANDLE)0x0) {
      local_24 = 0xd9;
    }
    else {
      *isOriginalRequestContent = false;
      local_24 = 0;
    }
  }
  else {
    *isOriginalRequestContent = true;
    *toBeUsedRequestContent = originalRequestContent;
    local_24 = 0;
  }
  return local_24;
}

Assistant:

static int buildBufferIfNotExist(BUFFER_HANDLE originalRequestContent, bool* isOriginalRequestContent, BUFFER_HANDLE* toBeUsedRequestContent)
{
    int result;
    if (originalRequestContent == NULL)
    {
        *toBeUsedRequestContent = BUFFER_new();
        if (*toBeUsedRequestContent == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            *isOriginalRequestContent = false;
            result = 0;
        }
    }
    else
    {
        *isOriginalRequestContent = true;
        *toBeUsedRequestContent = originalRequestContent;
        result = 0;
    }
    return result;
}